

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::PrintCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  int iVar2;
  Output local_20;
  
  sVar1 = DAT_001b6788;
  if (params != (char *)0x0 && DAT_001b6788 != 0) {
    iVar2 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788);
    if (iVar2 == 0) {
      if (params[sVar1] != '\0') {
        iVar2 = isspace((int)params[sVar1]);
        if (iVar2 == 0) goto LAB_00135a24;
      }
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,token::Print_abi_cxx11_,DAT_001b68a8);
      Output::~Output(&local_20);
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Output text representation of the current position.",0x33);
      Output::~Output(&local_20);
      return;
    }
  }
LAB_00135a24:
  iVar2 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar2 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  (*this->engine->_vptr_ChessEngine[0xc])();
  return;
}

Assistant:

void UCIAdapter::PrintCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Print;
    Output() << "Output text representation of the current position.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  engine->PrintBoard();
}